

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_parser.cpp
# Opt level: O0

int __thiscall coda_url::create_absolute(coda_url *this,char *u,size_t sz,uint32_t flags)

{
  bool bVar1;
  char *pcVar2;
  undefined4 in_ECX;
  char *in_RDX;
  coda_url *in_RSI;
  coda_url *in_RDI;
  undefined4 in_stack_ffffffffffffffd8;
  int local_4;
  
  bVar1 = empty(in_RDI);
  if (((bVar1) && (in_RDX != (char *)0x0)) && (in_RSI != (coda_url *)0x0)) {
    pcVar2 = (char *)malloc((long)in_RDX * 2 + 0xb);
    in_RDI->val_str = pcVar2;
    create_scheme(in_RSI,in_RDX,CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                  (uint32_t)((ulong)in_RDI >> 0x20));
    local_4 = 0;
  }
  else {
    reset(in_RDI);
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int coda_url::create_absolute(const char *u, size_t sz, uint32_t flags)
{
	if (!empty() || 0 == sz || NULL == u)
	{
		reset();
		return -1;
	}

	val_str = (char *) malloc(2 + 2 * sz + 9); // val + 0 + dom + 0 + "http[s]://" + "/"

	create_scheme(u, sz, flags);

	return 0;
}